

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osQueue.cpp
# Opt level: O0

bool __thiscall osQueue::Put(osQueue *this,void *item)

{
  bool bVar1;
  int iVar2;
  bool rc;
  int next;
  void *item_local;
  osQueue *this_local;
  
  osMutex::Take(&this->Lock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/os_support/osQueue.cpp"
                ,0x71);
  iVar2 = Increment(this,this->NextInIndex);
  bVar1 = this->ElementCount < this->MaxElements;
  if (bVar1) {
    this->Array[this->NextInIndex] = item;
    this->NextInIndex = iVar2;
    this->ElementCount = this->ElementCount + 1;
  }
  osMutex::Give(&this->Lock);
  return bVar1;
}

Assistant:

bool osQueue::Put(void* item)
{
    int next;
    bool rc = true;

    Lock.Take(__FILE__, __LINE__);

    next = Increment(NextInIndex);
    if (ElementCount >= MaxElements)
    {
        // Queue is full, so don't add item
        rc = false;
    }
    else
    {
        Array[NextInIndex] = item;
        NextInIndex = next;
        ElementCount++;
    }

    Lock.Give();
    return rc;
}